

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_map.c
# Opt level: O1

char addEntry(Entry *entries,uint32_t capacity,Value key,Value value)

{
  Entry *pEVar1;
  ValueType VVar2;
  char cVar3;
  uint32_t uVar4;
  uint uVar5;
  ulong uVar6;
  Value b;
  Value value_00;
  Value a;
  
  b.field_1 = key.field_1;
  b.type = key.type;
  value_00._4_4_ = 0;
  value_00.type = b.type;
  value_00.field_1.objHeader = b.field_1.objHeader;
  uVar4 = hashValue(value_00);
  uVar6 = (ulong)uVar4 % (ulong)capacity;
  do {
    pEVar1 = entries + uVar6;
    VVar2 = entries[uVar6].key.type;
    a._4_4_ = 0;
    a.type = VVar2;
    if (VVar2 == VT_UNDEFINED) {
      (pEVar1->key).type = b.type;
      (pEVar1->key).field_1.objHeader = (ObjHeader *)b.field_1;
      cVar3 = '\x01';
LAB_00104a6d:
      (pEVar1->value).type = value.type;
      (pEVar1->value).field_1 = value.field_1;
      return cVar3;
    }
    b._4_4_ = 0;
    a.field_1.objHeader = (pEVar1->key).field_1.objHeader;
    cVar3 = valueIsEqual(a,b);
    if (cVar3 != '\0') {
      cVar3 = '\0';
      goto LAB_00104a6d;
    }
    uVar5 = (int)uVar6 + 1;
    if (uVar5 == capacity) {
      uVar5 = 0;
    }
    uVar6 = (ulong)uVar5;
  } while( true );
}

Assistant:

static bool addEntry(Entry *entries, uint32_t capacity, Value key, Value value) {
    uint32_t index = hashValue(key) % capacity;

    //通过开放探测法去找可用的slot
    while (true) {
        //找到空闲的slot,说明目前没有此key,直接赋值返回
        if (entries[index].key.type == VT_UNDEFINED) {
            entries[index].key = key;
            entries[index].value = value;
            return true;       //新的key就返回true
        } else if (valueIsEqual(entries[index].key, key)) { //key已经存在,仅仅更新值就行
            entries[index].value = value;
            return false;    // 未增加新的key就返回false
        }

        //开放探测定址,尝试下一个slot
        index = (index + 1) % capacity;
    }
}